

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O3

ClauseHead * Clasp::ClauseCreator::newProblemClause(Solver *s,ClauseRep *clause,uint32 flags)

{
  undefined1 *puVar1;
  Literal *pLVar2;
  bool bVar3;
  uint uVar4;
  uint32 uVar5;
  uint32 uVar6;
  ClauseHead *c;
  SharedLiterals *shared_lits;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint32 uVar11;
  uint uVar12;
  
  if ((flags >> 10 & 1) == 0) {
    uVar7 = 2;
    if ((flags >> 0xc & 1) == 0) {
      uVar7 = SUB84(s->strategy_,4) >> 0xf & 3;
    }
    uVar4 = 0;
    if ((flags >> 0xb & 1) == 0) {
      uVar4 = uVar7;
    }
    puVar1 = &clause->field_0x4;
    uVar7 = *(uint *)&clause->field_0x4 & 0x7fffffff;
    if ((2 < uVar7) && (uVar4 != 1)) {
      if (uVar4 == 2) {
        uVar5 = Solver::numWatches(s,(Literal)(clause->lits->rep_ & 0xfffffffe ^ 2));
        uVar6 = Solver::numWatches(s,(Literal)(clause->lits[1].rep_ & 0xfffffffe ^ 2));
        bVar3 = uVar5 <= uVar6;
        uVar11 = uVar6;
        if (!bVar3) {
          uVar11 = uVar5;
          uVar5 = uVar6;
        }
        uVar9 = (ulong)bVar3;
        uVar8 = (ulong)!bVar3;
        if (((*(uint *)puVar1 & 0x7fffffff) == 2) || (uVar11 == 0)) {
          uVar7 = (uint)!bVar3;
        }
        else {
          uVar4 = 3;
          do {
            uVar7 = (uint)uVar8;
            uVar10 = uVar4 - 1;
            uVar6 = Solver::numWatches(s,(Literal)(clause->lits[uVar10].rep_ & 0xfffffffe ^ 2));
            uVar12 = uVar6;
            if (uVar6 < uVar5) {
              uVar8 = (ulong)uVar10;
              uVar12 = uVar5;
              uVar5 = uVar6;
              uVar10 = uVar7;
            }
            uVar7 = (uint)uVar8;
            if (uVar12 < uVar11) {
              uVar9 = (ulong)uVar10;
              uVar11 = uVar12;
            }
          } while ((uVar4 != (*(uint *)puVar1 & 0x7fffffff)) && (uVar4 = uVar4 + 1, uVar11 != 0));
        }
      }
      else if (uVar4 == 0) {
        uVar4 = (s->rng).seed_ * 0x343fd + 0x269ec3;
        (s->rng).seed_ = uVar4;
        uVar7 = (uint)(long)((double)uVar7 * (double)(uVar4 >> 0x10 & 0x7fff) * 3.0517578125e-05);
        do {
          uVar12 = *(uint *)puVar1;
          uVar4 = uVar4 * 0x343fd + 0x269ec3;
          (s->rng).seed_ = uVar4;
          uVar9 = (ulong)((double)(uVar12 & 0x7fffffff) *
                         (double)(uVar4 >> 0x10 & 0x7fff) * 3.0517578125e-05);
        } while ((uint)uVar9 == uVar7);
      }
      else {
        uVar9 = 1;
        uVar7 = 0;
      }
      pLVar2 = clause->lits;
      uVar11 = pLVar2->rep_;
      pLVar2->rep_ = pLVar2[uVar7].rep_;
      pLVar2[uVar7].rep_ = uVar11;
      uVar11 = pLVar2[1].rep_;
      pLVar2[1].rep_ = pLVar2[uVar9 & 0xffffffff].rep_;
      pLVar2[uVar9 & 0xffffffff].rep_ = uVar11;
    }
  }
  uVar7 = *(uint *)&clause->field_0x4;
  if (((uVar7 & 0x7ffffffe) < 6) || (((s->shared_->share_).field_0x2 & 0x10) == 0)) {
    c = Clause::newClause(s,clause);
  }
  else {
    pLVar2 = clause->lits;
    uVar4 = (clause->info).super_ConstraintScore.rep;
    shared_lits = (SharedLiterals *)operator_new((ulong)(uVar7 * 4 + 8));
    shared_lits->size_type_ = (uVar4 >> 0x1c & 3) + uVar7 * 4;
    LOCK();
    (shared_lits->refCount_).super___atomic_base<int>._M_i = 1;
    UNLOCK();
    if (pLVar2 != (Literal *)0x0) {
      memcpy(shared_lits + 1,pLVar2,(ulong)(uVar7 & 0x7fffffff) << 2);
    }
    c = mt::SharedLitsClause::newClause(s,shared_lits,&clause->info,clause->lits,false);
  }
  if ((flags & 1) == 0) {
    Solver::add(s,&c->super_Constraint);
  }
  return c;
}

Assistant:

ClauseHead* ClauseCreator::newProblemClause(Solver& s, const ClauseRep& clause, uint32 flags) {
	ClauseHead* ret;
	Solver::WatchInitMode wMode = s.watchInitMode();
	if      (flags&clause_watch_first){ wMode = SolverStrategies::watch_first;}
	else if (flags&clause_watch_rand) { wMode = SolverStrategies::watch_rand; }
	else if (flags&clause_watch_least){ wMode = SolverStrategies::watch_least;}
	if (clause.size > 2 && wMode != SolverStrategies::watch_first) {
		uint32 fw = 0, sw = 1;
		if (wMode == SolverStrategies::watch_rand) {
			fw = s.rng.irand(clause.size);
			do { sw = s.rng.irand(clause.size); } while (sw == fw);
		}
		else if (wMode == SolverStrategies::watch_least) {
			uint32 cw1 = s.numWatches(~clause.lits[0]);
			uint32 cw2 = s.numWatches(~clause.lits[1]);
			if (cw1 > cw2) { std::swap(fw, sw); std::swap(cw1, cw2); }
			for (uint32 i = 2; i != clause.size && cw2; ++i) {
				uint32 p   = i;
				uint32 cwp = s.numWatches(~clause.lits[i]);
				if (cwp < cw1) { std::swap(cwp, cw1); std::swap(fw, p); }
				if (cwp < cw2) { std::swap(cwp, cw2); std::swap(sw, p); }
			}
		}
		std::swap(clause.lits[0], clause.lits[fw]);
		std::swap(clause.lits[1], clause.lits[sw]);
	}
	if (clause.size <= Clause::MAX_SHORT_LEN || !s.sharedContext()->physicalShareProblem()) {
		ret = Clause::newClause(s, clause);
	}
	else {
		ret = Clause::newShared(s, SharedLiterals::newShareable(clause.lits, clause.size, clause.info.type(), 1), clause.info, clause.lits, false);
	}
	if ( (flags & clause_no_add) == 0 ) {
		assert(!clause.info.aux());
		s.add(ret);
	}
	return ret;
}